

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InsertKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pIVar5;
  int iVar6;
  long lVar7;
  Addr Cp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> D;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> T;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> A;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_200,this->N);
  if ((this->RootAddr).FileOff == -1) {
    local_200.NodeState = '1';
    local_200.parent.BlockNum = -1;
    local_200.parent.FileOff = -1;
    *local_200.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = '1';
    std::__cxx11::string::_M_assign
              ((string *)
               local_200.k.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    *local_200.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
     _M_start = p;
    InsertNode(this,&local_200);
    this->RootAddr = local_200.self;
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&local_80,&local_200);
    UpdateBlock(this,&local_80);
    pIVar5 = &local_80;
  }
  else {
    std::__cxx11::string::string((string *)&local_220,(string *)k);
    FindFirstKey(this,&local_220,&Cp);
    std::__cxx11::string::~string((string *)&local_220);
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&A,this->N);
    FindNode(this,Cp,&A);
    if (A.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [(long)this->N + -2] == '0') {
      std::__cxx11::string::string((string *)&local_240,(string *)k);
      Insert_Leaf(this,&A,&local_240,p);
      std::__cxx11::string::~string((string *)&local_240);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&local_e0,&A);
      UpdateBlock(this,&local_e0);
      pIVar5 = &local_e0;
    }
    else {
      InsertNode(this,&local_200);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&B,this->N);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&D,this->N);
      FindNode(this,Cp,&B);
      FindNode(this,local_200.self,&D);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&T,&B);
      std::__cxx11::string::string((string *)&local_320,(string *)k);
      Insert_Leaf(this,&T,&local_320,p);
      std::__cxx11::string::~string((string *)&local_320);
      for (lVar2 = 0; uVar4 = (ulong)this->N, lVar2 < (long)(uVar4 - 1); lVar2 = lVar2 + 1) {
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2].BlockNum = -1;
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2].FileOff = -1;
        B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2] = '0';
      }
      lVar2 = 0;
      lVar7 = 0;
      while( true ) {
        iVar3 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 2);
        if ((int)((uint)(iVar3 * 2 < (int)uVar4) + iVar3) <= lVar7) break;
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((B.k.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2))
        ;
        B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = '1';
        lVar7 = lVar7 + 1;
        uVar4 = (ulong)(uint)this->N;
        lVar2 = lVar2 + 0x20;
      }
      while( true ) {
        iVar3 = (int)uVar4;
        lVar2 = (long)iVar3;
        if (lVar2 <= lVar7) break;
        iVar1 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 2);
        iVar6 = (int)lVar7;
        D.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(iVar6 - ((uint)(iVar1 * 2 < iVar3) + iVar1))] =
             T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7];
        iVar3 = this->N / 2;
        std::__cxx11::string::_M_assign
                  ((string *)
                   (D.k.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   (int)(iVar6 - ((uint)(iVar3 * 2 < this->N) + iVar3))));
        iVar3 = this->N / 2;
        D.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(iVar6 - ((uint)(iVar3 * 2 < this->N) + iVar3))] = '1';
        lVar7 = lVar7 + 1;
        uVar4 = (ulong)(uint)this->N;
      }
      D.NodeState = '1';
      D.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar2 + -1] = B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2 + -1];
      B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar2 + -1] = D.self;
      std::__cxx11::string::string
                ((string *)&k2,
                 (string *)
                 D.k.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::string((string *)&local_360,(string *)&k2);
      Insert_Parent(this,&B,&local_360,&D);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&k2);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~IndexNode(&T);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~IndexNode(&D);
      pIVar5 = &B;
    }
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~IndexNode(pIVar5);
    pIVar5 = &A;
  }
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(pIVar5);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_200);
  return;
}

Assistant:

void BpTree<K>::InsertKey(K k, Addr p) {
	int i;
	IndexNode<K> C(N);
	if (this->RootAddr.FileOff == -1) {
		C.NodeState = LEAF;		//����
		C.parent = { -1, -1 };
		C.v[0] = '1';		C.k[0] = k;		C.p[0] = p;
		this->InsertNode(C);
		this->RootAddr = C.self;
		this->UpdateBlock(C);
		return;
	}
	Addr Cp;
	int temp = this->FindFirstKey(k, Cp);	//���ǿ���
	IndexNode<K> A(N);
	this->FindNode(Cp, A);
	if (A.v[N-2] == '0') {
		this->Insert_Leaf(A, k, p);		//�п�
		this->UpdateBlock(A);
		return;
	}
	this->InsertNode(C);				//������ˣ�����½��
	IndexNode<K> B(N);
	IndexNode<K> D(N);
	this->FindNode(Cp, B);
	this->FindNode(C.self, D);
	IndexNode<K> T = B;
	this->Insert_Leaf(T, k, p);
	for (i = 0; i < N - 1; i++) {
		B.p[i] = { -1, -1 };			//���B.p[0]��B.p[N - 2]
		B.v[i] = '0';					//���B.v[0]��B.v[N - 2]
	}
	for (i = 0; i < MIN_POINTS_NONLEAF; i++) {		//���¾ɽ��
		B.p[i] = T.p[i];
		B.k[i] = T.k[i];
		B.v[i] = '1';
	}
	for (; i < N; i++) {							//�����½��
		D.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		D.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		D.v[i - MIN_POINTS_NONLEAF] = '1';
	}
	D.NodeState = LEAF;
	D.p[N - 1].BlockNum = B.p[N - 1].BlockNum;	//�½�����ָ���������ϣ����Բ���ԭ������
	D.p[N - 1].FileOff = B.p[N - 1].FileOff;
	
	B.p[N - 1] = D.self;		//�ɽڵ���������������
	K k2 = D.k[0];
	Insert_Parent(B, k2, D);
}